

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_4be406::PpuTest_nmi_is_not_triggered_if_disabled_Test::TestBody
          (PpuTest_nmi_is_not_triggered_if_disabled_Test *this)

{
  pointer *__ptr;
  int iVar1;
  char *in_R9;
  bool triggered;
  AssertionResult gtest_ar_;
  byte local_59;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  AssertHelper local_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  local_48._0_8_ = &local_59;
  local_59 = 0;
  (this->super_PpuTest).expected.ctrl.value_ = '\0';
  (this->super_PpuTest).registers.ctrl.value_ = '\0';
  local_48._8_8_ = 0;
  local_38._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp:171:26)>
       ::_M_invoke;
  local_38._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp:171:26)>
       ::_M_manager;
  (*((this->super_PpuTest).ppu._M_t.
     super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>._M_t.
     super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
     super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl)->_vptr_IPpu[5])();
  if ((code *)local_38._0_8_ != (code *)0x0) {
    (*(code *)local_38._0_8_)(local_48,local_48,3);
  }
  iVar1 = 0x53408;
  do {
    (*((this->super_PpuTest).ppu._M_t.
       super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>._M_t.
       super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
       super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl)->_vptr_IPpu[4])();
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  local_28[0] = (internal)(local_59 ^ 1);
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_59 != 0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,local_28,(AssertionResult *)"triggered","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp"
               ,0xaf,(char *)local_48._0_8_);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((undefined1 *)local_48._0_8_ != local_38) {
      operator_delete((void *)local_48._0_8_,(ulong)(local_38._0_8_ + 1));
    }
    if (local_58._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_58._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  return;
}

Assistant:

TEST_F(PpuTest, nmi_is_not_triggered_if_disabled) {
    bool triggered = false;
    registers.ctrl = expected.ctrl = PpuCtrl(0x00);
    ppu->set_nmi_handler([&] { triggered = true; });

    // Nmi shouldn't get triggered since bit 7 in ctrl is 0.
    step_execution(kCyclesPerScanline * 1000);
    ASSERT_FALSE(triggered);
}